

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O3

void __thiscall
cali::CompressedSnapshotRecordView::unpack_immediate
          (CompressedSnapshotRecordView *this,size_t n,cali_id_t *attr_vec,Variant *data_vec)

{
  long lVar1;
  uchar *puVar2;
  byte bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  cali_variant_t cVar8;
  size_t pos;
  size_t local_38;
  
  if (this->m_num_imm < n) {
    n = this->m_num_imm;
  }
  local_38 = this->m_imm_pos + 1;
  if (n != 0) {
    uVar4 = 0;
    do {
      puVar2 = this->m_buffer;
      bVar3 = 0;
      lVar5 = 0;
      uVar6 = 0;
      do {
        bVar7 = puVar2[lVar5 + local_38];
        if (-1 < (char)bVar7) goto LAB_00186e44;
        uVar6 = uVar6 | (ulong)(bVar7 & 0x7f) << (bVar3 & 0x3f);
        lVar5 = lVar5 + 1;
        bVar3 = bVar3 + 7;
      } while (lVar5 != 9);
      bVar7 = puVar2[local_38 + 9];
      lVar5 = 9;
LAB_00186e44:
      lVar1 = local_38 + lVar5;
      local_38 = local_38 + lVar5 + 1;
      attr_vec[uVar4] = (ulong)(bVar7 & 0x7f) << ((char)lVar5 * '\a' & 0x3fU) | uVar6;
      cVar8 = cali_variant_unpack(puVar2 + lVar1 + 1,&local_38,(_Bool *)0x0);
      data_vec[uVar4].m_v.type_and_size = cVar8.type_and_size;
      data_vec[uVar4].m_v.value.v_uint = (uint64_t)cVar8.value;
      uVar4 = uVar4 + 1;
    } while (uVar4 != n);
  }
  return;
}

Assistant:

void CompressedSnapshotRecordView::unpack_immediate(size_t n, cali_id_t attr_vec[], Variant data_vec[]) const
{
    size_t max = std::min(n, m_num_imm);
    size_t pos = m_imm_pos + 1;

    for (size_t i = 0; i < max; ++i) {
        attr_vec[i] = vldec_u64(m_buffer + pos, &pos);
        data_vec[i] = Variant::unpack(m_buffer + pos, &pos, nullptr);
    }
}